

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

void __thiscall rcg::Buffer::setHandle(Buffer *this,void *handle)

{
  element_type *peVar1;
  size_t sVar2;
  GC_ERROR GVar3;
  void *pvVar4;
  unsigned_long ret;
  INFO_DATATYPE type;
  size_t size;
  size_t local_30;
  INFO_DATATYPE local_24;
  size_t local_20;
  
  this->buffer = handle;
  this->payload_type = 0;
  this->multipart = false;
  if (handle == (void *)0x0) {
    if ((this->chunkadapter).
        super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      GenApi_3_4::CChunkAdapter::DetachBuffer();
      return;
    }
  }
  else {
    pvVar4 = Stream::getHandle(this->parent);
    local_30 = 0;
    local_20 = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferInfo)(pvVar4,this->buffer,0x13,&local_24,&local_30,&local_20);
      if (GVar3 != 0) {
        local_30 = 0;
      }
    }
    this->payload_type = local_30;
    pvVar4 = Stream::getHandle(this->parent);
    local_30 = 0;
    local_20 = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
      GVar3 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                DSGetBufferInfo)(pvVar4,this->buffer,0x13,&local_24,&local_30,&local_20);
      if (GVar3 != 0) {
        local_30 = 0;
      }
    }
    this->multipart = local_30 == 10;
    if ((this->chunkadapter).
        super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pvVar4 = Stream::getHandle(this->parent);
      local_24._0_1_ = '\0';
      local_30 = 1;
      if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
        (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->DSGetBufferInfo)
                  (pvVar4,this->buffer,7,(INFO_DATATYPE *)&local_20,&local_24,&local_30);
      }
      if ((char)local_24 == '\0') {
        peVar1 = (this->chunkadapter).
                 super___shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pvVar4 = Stream::getHandle(this->parent);
        local_30 = 0;
        local_20 = 8;
        if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
          GVar3 = (*((this->gentl).
                     super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->DSGetBufferInfo)(pvVar4,this->buffer,0,&local_24,&local_30,&local_20);
          if (GVar3 != 0) {
            local_30 = 0;
          }
        }
        sVar2 = local_30;
        pvVar4 = Stream::getHandle(this->parent);
        local_30 = 0;
        local_20 = 8;
        if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar4 != (void *)0x0) {
          GVar3 = (*((this->gentl).
                     super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->DSGetBufferInfo)(pvVar4,this->buffer,9,&local_24,&local_30,&local_20);
          if (GVar3 != 0) {
            local_30 = 0;
          }
        }
        (**(code **)(*(long *)peVar1 + 0x18))(peVar1,sVar2,local_30,0);
      }
    }
  }
  return;
}

Assistant:

void Buffer::setHandle(void *handle)
{
  buffer=handle;

  payload_type=PAYLOAD_TYPE_UNKNOWN;
  multipart=false;

  if (buffer != 0)
  {
    payload_type=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                        GenTL::BUFFER_INFO_PAYLOADTYPE);

    multipart=getBufferValue<size_t>(gentl, parent->getHandle(), buffer,
                                     GenTL::BUFFER_INFO_PAYLOADTYPE) == PAYLOAD_TYPE_MULTI_PART;

    if (chunkadapter && !getBufferBool(gentl, parent->getHandle(), buffer,
      GenTL::BUFFER_INFO_IS_INCOMPLETE))
    {
      chunkadapter->AttachBuffer(reinterpret_cast<uint8_t *>(
        getBufferValue<void *>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_BASE)),
        static_cast<int64_t>(getBufferValue<size_t>(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_SIZE_FILLED)));
    }
  }
  else
  {
    if (chunkadapter)
    {
      chunkadapter->DetachBuffer();
    }
  }
}